

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

string * __thiscall ast::Number::toString_abi_cxx11_(string *__return_storage_ptr__,Number *this)

{
  ostringstream msg;
  string sStack_1a8;
  ostringstream local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__cxx11::to_string(&sStack_1a8,this->value);
  std::operator<<((ostream *)local_188,(string *)&sStack_1a8);
  std::__cxx11::string::~string((string *)&sStack_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::Number::toString() const {
    std::ostringstream msg;
    msg << std::to_string(value);
    return msg.str();
}